

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

bool __thiscall
helics::FilterFederate::destinationProcessMessage
          (FilterFederate *this,ActionMessage *command,BasicHandleInfo *handle)

{
  atomic<int> *paVar1;
  int iVar2;
  GlobalFederateId fid;
  FilterInfo *pFVar3;
  element_type *peVar4;
  __type _Var5;
  FilterCoordinator *fcoord;
  uint32_t pid;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> nmessage;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> tempMessage;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_68;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_60;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_58;
  string odest;
  
  fcoord = getFilterCoordinator(this,(InterfaceHandle)(handle->handle).handle.hid);
  if (fcoord == (FilterCoordinator *)0x0) {
    return true;
  }
  pFVar3 = fcoord->destFilter;
  if ((pFVar3 != (FilterInfo *)0x0) && ((pFVar3->flags & 0x1000) == 0)) {
    if ((pFVar3->core_id).gid != (this->mFedID).gid) {
      LOCK();
      paVar1 = &this->messageCounter;
      iVar2 = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pid = iVar2 + 1;
      fid.gid = (handle->handle).fed_id.gid;
      generateDestProcessMarker(this,fid,pid,(Time)(command->actionTime).internalTimeCode);
      ActionMessage::setAction(command,cmd_send_for_dest_filter_return);
      command->sequenceID = pid;
      (command->source_id).gid = fid.gid;
      (command->source_handle).hid = (handle->handle).handle.hid;
      pFVar3 = fcoord->destFilter;
      (command->dest_id).gid = (pFVar3->core_id).gid;
      (command->dest_handle).hid = (pFVar3->handle).hid;
      std::function<void_(helics::ActionMessage_&&)>::operator()(&this->mSendMessageMove,command);
      return false;
    }
    if ((pFVar3->filterOp).super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      createMessageFromCommand((helics *)&tempMessage,command);
      std::__cxx11::string::string
                ((string *)&odest,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)tempMessage._M_t.
                        super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                        .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x70));
      peVar4 = (fcoord->destFilter->filterOp).
               super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58 = (unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)
                 tempMessage._M_t.
                 super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      tempMessage._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
      ._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
           (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
           (__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>)0x0;
      (*peVar4->_vptr_FilterOperator[2])(&nmessage,peVar4,&local_58);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                (&local_58);
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &odest,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)nmessage._M_t.
                                               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                                               .super__Head_base<0UL,_helics::Message_*,_false>.
                                               _M_head_impl + 0x70));
      if (_Var5) {
        local_60 = (unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)
                   nmessage._M_t.
                   super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                   super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        nmessage._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
        _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>)0x0;
        ActionMessage::operator=(command,&local_60);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  (&local_60);
      }
      else {
        local_68 = (unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)
                   nmessage._M_t.
                   super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                   super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        nmessage._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
        _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>)0x0;
        ActionMessage::operator=(command,&local_68);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  (&local_68);
        std::function<void_(helics::ActionMessage_&)>::operator()(&this->mDeliverMessage,command);
      }
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                (&nmessage);
      std::__cxx11::string::~string((string *)&odest);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                (&tempMessage);
      if (!_Var5) {
        return false;
      }
    }
  }
  if ((fcoord->cloningDestFilters).
      super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (fcoord->cloningDestFilters).
      super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    runCloningDestinationFilters(this,fcoord,handle,command);
  }
  return true;
}

Assistant:

bool FilterFederate::destinationProcessMessage(ActionMessage& command,
                                               const BasicHandleInfo* handle)
{
    auto* ffunc = getFilterCoordinator(handle->getInterfaceHandle());
    if (ffunc != nullptr) {
        if (ffunc->destFilter != nullptr) {
            if (!checkActionFlag(*(ffunc->destFilter), disconnected_flag)) {
                if (ffunc->destFilter->core_id != mFedID) {  // now we have deal with non-local
                                                             // processing destination filter
                    // first block the federate time advancement until the return is
                    // received
                    auto mid = ++messageCounter;
                    auto fed_id = handle->getFederateId();
                    generateDestProcessMarker(handle->getFederateId(), mid, command.actionTime);

                    // now send a message to get filtered
                    command.setAction(CMD_SEND_FOR_DEST_FILTER_AND_RETURN);
                    command.sequenceID = mid;
                    command.source_id = fed_id;
                    command.source_handle = handle->getInterfaceHandle();
                    command.dest_id = ffunc->destFilter->core_id;
                    command.dest_handle = ffunc->destFilter->handle;

                    mSendMessageMove(std::move(command));
                    return false;
                }
                // the filter is part of this core

                if (ffunc->destFilter->filterOp) {
                    auto tempMessage = createMessageFromCommand(std::move(command));
                    auto odest = tempMessage->dest;
                    auto nmessage = ffunc->destFilter->filterOp->process(std::move(tempMessage));
                    if (odest == nmessage->dest) {
                        command = std::move(nmessage);
                    } else {
                        // handle destination reroute filters
                        command = std::move(nmessage);
                        mDeliverMessage(command);
                        return false;
                    }
                }
            }
        }
        if (!ffunc->cloningDestFilters.empty()) {
            runCloningDestinationFilters(ffunc, handle, command);
        }
    }
    return true;
}